

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void set_ext_params_cam(xc_func_type *p,double *ext_params)

{
  int iVar1;
  double *in_RSI;
  xc_func_type *in_RDI;
  double dVar2;
  int nparams;
  
  iVar1 = (in_RDI->info->ext_params).n;
  dVar2 = get_ext_param(in_RDI,in_RSI,iVar1 + -3);
  in_RDI->cam_alpha = dVar2;
  dVar2 = get_ext_param(in_RDI,in_RSI,iVar1 + -2);
  in_RDI->cam_beta = dVar2;
  dVar2 = get_ext_param(in_RDI,in_RSI,iVar1 + -1);
  in_RDI->cam_omega = dVar2;
  return;
}

Assistant:

void
set_ext_params_cam(xc_func_type *p, const double *ext_params)
{
  int nparams;
  assert(p != NULL);
  nparams = p->info->ext_params.n - 3;

  p->cam_alpha = get_ext_param(p, ext_params, nparams);
  p->cam_beta = get_ext_param(p, ext_params, nparams + 1);
  p->cam_omega = get_ext_param(p, ext_params, nparams + 2);
}